

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deInt32.h
# Opt level: O0

deInt32 deIntMinValue32(int numBits)

{
  undefined4 local_c;
  int numBits_local;
  
  if (numBits < 0x20) {
    local_c = -(1 << ((char)numBits - 1U & 0x1f));
  }
  else {
    local_c = -0x80000000;
  }
  return local_c;
}

Assistant:

DE_INLINE deInt32 deIntMinValue32 (int numBits)
{
	DE_ASSERT(deInRange32(numBits, 1, 32));
	if (numBits < 32)
		return -((deInt32)1 << (numBits - 1));
	else
	{
		/* avoid undefined behavior of int overflow when shifting */
		return (deInt32)(-0x7FFFFFFF - 1);
	}
}